

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsf_Emu.cpp
# Opt level: O0

void __thiscall Nsf_Emu::Nsf_Emu(Nsf_Emu *this)

{
  Music_Emu *in_RDI;
  Classic_Emu *in_stack_ffffffffffffffe0;
  Nes_Apu *this_00;
  
  Nes_Cpu::Nes_Cpu((Nes_Cpu *)&in_RDI[1].super_Gme_File.user_cleanup_);
  Classic_Emu::Classic_Emu(in_stack_ffffffffffffffe0);
  (in_RDI->super_Gme_File)._vptr_Gme_File = (_func_int **)&PTR__Nsf_Emu_00b8fb70;
  this_00 = (Nes_Apu *)&in_RDI[6].silence_time;
  Rom_Data<4096>::Rom_Data((Rom_Data<4096> *)0x95e5b6);
  Nes_Apu::Nes_Apu(this_00);
  in_RDI[7].super_Gme_File._vptr_Gme_File = (_func_int **)0x0;
  in_RDI[6].effects_buffer = (Multi_Buffer *)0x0;
  in_RDI[7].super_Gme_File.type_ = (gme_type_t)0x0;
  Gme_File::set_type(&in_RDI->super_Gme_File,&gme_nsf_type_);
  Music_Emu::set_silence_lookahead(in_RDI,6);
  Nes_Apu::dmc_reader((Nes_Apu *)&in_RDI[7].super_Gme_File.track_count_,pcm_read,in_RDI);
  Music_Emu::set_equalizer((Music_Emu *)this_00,(equalizer_t *)in_RDI);
  Music_Emu::set_gain(in_RDI,1.4);
  memset(in_RDI + 0x22,0xf2,0x808);
  return;
}

Assistant:

Nsf_Emu::Nsf_Emu()
{
	vrc6  = 0;
	namco = 0;
	fme7  = 0;
	
	set_type( gme_nsf_type );
	set_silence_lookahead( 6 );
	apu.dmc_reader( pcm_read, this );
	Music_Emu::set_equalizer( nes_eq );
	set_gain( 1.4 );
	memset( unmapped_code, Nes_Cpu::bad_opcode, sizeof unmapped_code );
}